

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cio.c
# Opt level: O3

void opj_stream_destroy(opj_stream_t *p_stream)

{
  opj_stream_private_t *l_stream;
  
  if (p_stream != (opj_stream_t *)0x0) {
    if ((code *)p_stream[1] != (code *)0x0) {
      (*(code *)p_stream[1])(*p_stream);
    }
    opj_free(p_stream[7]);
    p_stream[7] = (opj_stream_t)0x0;
    opj_free(p_stream);
    return;
  }
  return;
}

Assistant:

void OPJ_CALLCONV opj_stream_destroy(opj_stream_t* p_stream)
{
	opj_stream_private_t* l_stream = (opj_stream_private_t*) p_stream;
	
	if (l_stream) {
		if (l_stream->m_free_user_data_fn) {
			l_stream->m_free_user_data_fn(l_stream->m_user_data);
		}
		opj_free(l_stream->m_stored_data);
		l_stream->m_stored_data = 00;
		opj_free(l_stream);
	}
}